

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O0

void av1_calculate_tile_cols
               (SequenceHeader *seq_params,int cm_mi_rows,int cm_mi_cols,CommonTileParams *tiles)

{
  int iVar1;
  int iVar2;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int size_sb_1;
  int narrowest_inner_tile_sb;
  int widest_tile_sb;
  int max_tile_area_sb;
  int size_sb;
  int start_sb;
  int i;
  int sb_rows;
  int sb_cols;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_28;
  int local_24;
  
  iVar1 = in_EDX + (1 << ((byte)*(undefined4 *)(in_RDI + 0x24) & 0x1f)) + -1 >>
          ((byte)*(undefined4 *)(in_RDI + 0x24) & 0x1f);
  local_30 = in_ESI + (1 << ((byte)*(undefined4 *)(in_RDI + 0x24) & 0x1f)) + -1 >>
             ((byte)*(undefined4 *)(in_RDI + 0x24) & 0x1f);
  in_RCX[4] = -1;
  if (in_RCX[5] == 0) {
    local_30 = local_30 * iVar1;
    local_34 = 1;
    local_38 = 0x10000;
    iVar1 = tile_log2(1,*in_RCX);
    in_RCX[6] = iVar1;
    for (local_24 = 0; local_24 < *in_RCX; local_24 = local_24 + 1) {
      local_4c = in_RCX[(long)(local_24 + 1) + 0xf] - in_RCX[(long)local_24 + 0xf];
      local_48 = local_4c;
      if (local_4c < local_34) {
        local_48 = local_34;
      }
      local_34 = local_48;
      if (local_24 < *in_RCX + -1) {
        if (local_38 < local_4c) {
          local_4c = local_38;
        }
        local_38 = local_4c;
      }
    }
    if (in_RCX[0xe] != 0) {
      local_30 = local_30 >> ((char)in_RCX[0xe] + 1U & 0x1f);
    }
    if (local_30 / local_34 < 2) {
      local_50 = 1;
    }
    else {
      local_50 = local_30 / local_34;
    }
    in_RCX[3] = local_50;
    if (1 < *in_RCX) {
      in_RCX[4] = local_38 << ((byte)*(undefined4 *)(in_RDI + 0x24) & 0x1f);
    }
  }
  else {
    iVar2 = iVar1 + (1 << ((byte)in_RCX[6] & 0x1f)) + -1 >> ((byte)in_RCX[6] & 0x1f);
    local_24 = 0;
    for (local_28 = 0; local_28 < iVar1; local_28 = iVar2 + local_28) {
      in_RCX[(long)local_24 + 0xf] = local_28;
      local_24 = local_24 + 1;
    }
    *in_RCX = local_24;
    in_RCX[(long)local_24 + 0xf] = iVar1;
    if (in_RCX[0xe] - in_RCX[6] < 1) {
      local_40 = 0;
    }
    else {
      local_40 = in_RCX[0xe] - in_RCX[6];
    }
    in_RCX[0xb] = local_40;
    in_RCX[3] = local_30 >> ((byte)in_RCX[0xb] & 0x1f);
    in_RCX[8] = iVar2 << ((byte)*(undefined4 *)(in_RDI + 0x24) & 0x1f);
    local_44 = in_EDX;
    if (in_RCX[8] < in_EDX) {
      local_44 = in_RCX[8];
    }
    in_RCX[8] = local_44;
    if (1 < *in_RCX) {
      in_RCX[4] = in_RCX[8];
    }
  }
  return;
}

Assistant:

void av1_calculate_tile_cols(const SequenceHeader *const seq_params,
                             int cm_mi_rows, int cm_mi_cols,
                             CommonTileParams *const tiles) {
  int sb_cols = CEIL_POWER_OF_TWO(cm_mi_cols, seq_params->mib_size_log2);
  int sb_rows = CEIL_POWER_OF_TWO(cm_mi_rows, seq_params->mib_size_log2);
  int i;

  // This will be overridden if there is at least two columns of tiles
  // (otherwise there is no inner tile width)
  tiles->min_inner_width = -1;

  if (tiles->uniform_spacing) {
    int start_sb;
    int size_sb = CEIL_POWER_OF_TWO(sb_cols, tiles->log2_cols);
    assert(size_sb > 0);
    for (i = 0, start_sb = 0; start_sb < sb_cols; i++) {
      tiles->col_start_sb[i] = start_sb;
      start_sb += size_sb;
    }
    tiles->cols = i;
    tiles->col_start_sb[i] = sb_cols;
    tiles->min_log2_rows = AOMMAX(tiles->min_log2 - tiles->log2_cols, 0);
    tiles->max_height_sb = sb_rows >> tiles->min_log2_rows;

    tiles->width = size_sb << seq_params->mib_size_log2;
    tiles->width = AOMMIN(tiles->width, cm_mi_cols);
    if (tiles->cols > 1) {
      tiles->min_inner_width = tiles->width;
    }
  } else {
    int max_tile_area_sb = (sb_rows * sb_cols);
    int widest_tile_sb = 1;
    int narrowest_inner_tile_sb = 65536;
    tiles->log2_cols = tile_log2(1, tiles->cols);
    for (i = 0; i < tiles->cols; i++) {
      int size_sb = tiles->col_start_sb[i + 1] - tiles->col_start_sb[i];
      widest_tile_sb = AOMMAX(widest_tile_sb, size_sb);
      // ignore the rightmost tile in frame for determining the narrowest
      if (i < tiles->cols - 1)
        narrowest_inner_tile_sb = AOMMIN(narrowest_inner_tile_sb, size_sb);
    }
    if (tiles->min_log2) {
      max_tile_area_sb >>= (tiles->min_log2 + 1);
    }
    tiles->max_height_sb = AOMMAX(max_tile_area_sb / widest_tile_sb, 1);
    if (tiles->cols > 1) {
      tiles->min_inner_width = narrowest_inner_tile_sb
                               << seq_params->mib_size_log2;
    }
  }
}